

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  int iVar1;
  Expr *p;
  int local_54;
  Expr *pSub;
  Expr *pEStack_40;
  int iDummy;
  Expr *pDup;
  sqlite3 *db;
  int local_28;
  int nInit;
  int i;
  int bIntToNull_local;
  ExprList *pAppend_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  pAppend_local = pList;
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = pList->nExpr;
    }
    db._4_4_ = local_54;
    nInit = bIntToNull;
    _i = pAppend;
    pList_local = (ExprList *)pParse;
    for (local_28 = 0; local_28 < _i->nExpr; local_28 = local_28 + 1) {
      pDup = *(Expr **)pList_local;
      pEStack_40 = sqlite3ExprDup((sqlite3 *)pDup,_i->a[local_28].pExpr,0);
      if (*(char *)((long)&pDup[1].pRight + 7) != '\0') {
        sqlite3ExprDelete((sqlite3 *)pDup,pEStack_40);
        return pAppend_local;
      }
      if (nInit != 0) {
        p = sqlite3ExprSkipCollateAndLikely(pEStack_40);
        iVar1 = sqlite3ExprIsInteger(p,(int *)((long)&pSub + 4));
        if (iVar1 != 0) {
          p->op = 'y';
          p->flags = p->flags & 0xcffff7ff;
          (p->u).zToken = (char *)0x0;
        }
      }
      pAppend_local = sqlite3ExprListAppend((Parse *)pList_local,pAppend_local,pEStack_40);
      if (pAppend_local != (ExprList *)0x0) {
        pAppend_local->a[db._4_4_ + local_28].fg.sortFlags = _i->a[local_28].fg.sortFlags;
      }
    }
  }
  return pAppend_local;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}